

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSharedPtr.hpp
# Opt level: O0

SharedPtr<de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>_> * __thiscall
de::SharedPtr<de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>_>::
operator=(SharedPtr<de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>_>
          *this,SharedPtr<de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>_>
                *other)

{
  SharedPtr<de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>_>
  *other_local;
  SharedPtr<de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>_>
  *this_local;
  
  if (this->m_state != other->m_state) {
    release(this);
    this->m_ptr = other->m_ptr;
    this->m_state = other->m_state;
    acquire(this);
  }
  return this;
}

Assistant:

inline SharedPtr<T>& SharedPtr<T>::operator= (const SharedPtr<T>& other)
{
	if (m_state == other.m_state)
		return *this;

	// Release current reference.
	release();

	// Copy from other and acquire reference.
	m_ptr	= other.m_ptr;
	m_state	= other.m_state;

	acquire();

	return *this;
}